

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void lzma_sha256_update(uint8_t *buf,size_t size,lzma_check_state *check)

{
  ulong uVar1;
  ulong __n;
  
  if (size != 0) {
    do {
      uVar1 = (ulong)((uint)(check->state).sha256.size & 0x3f);
      __n = 0x40 - uVar1;
      if (size <= __n) {
        __n = size;
      }
      memcpy((void *)((long)&check->buffer + uVar1),buf,__n);
      uVar1 = (check->state).sha256.size + __n;
      (check->state).sha256.size = uVar1;
      if ((uVar1 & 0x3f) == 0) {
        process(check);
      }
      buf = buf + __n;
      size = size - __n;
    } while (size != 0);
  }
  return;
}

Assistant:

extern void
lzma_sha256_update(const uint8_t *buf, size_t size, lzma_check_state *check)
{
	// Copy the input data into a properly aligned temporary buffer.
	// This way we can be called with arbitrarily sized buffers
	// (no need to be multiple of 64 bytes), and the code works also
	// on architectures that don't allow unaligned memory access.
	while (size > 0) {
		const size_t copy_start = check->state.sha256.size & 0x3F;
		size_t copy_size = 64 - copy_start;
		if (copy_size > size)
			copy_size = size;

		memcpy(check->buffer.u8 + copy_start, buf, copy_size);

		buf += copy_size;
		size -= copy_size;
		check->state.sha256.size += copy_size;

		if ((check->state.sha256.size & 0x3F) == 0)
			process(check);
	}

	return;
}